

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.c
# Opt level: O0

int runThreefizer(arguments *args)

{
  _Bool _Var1;
  uint8_t *puVar2;
  queue *out;
  queue *out_00;
  queue *out_01;
  int local_42c;
  queue *write_queue;
  queue *mac_queue;
  queue *crypto_queue;
  uint8_t *temp_file_name;
  MacCtx_t mac_context;
  writeParams write_params;
  readParams read_params;
  macParams mac_params;
  cryptParams crypto_params;
  pthread_mutex_t write_mutex;
  pthread_mutex_t progress_mutex;
  pthread_mutex_t mac_mutex;
  pthread_mutex_t crypto_mutex;
  pthread_t write_thread;
  pthread_t mac_thread;
  pthread_t crypto_thread;
  pthread_t read_thread;
  progress_t progress;
  int32_t error;
  _Bool valid;
  _Bool running;
  _Bool mac_status;
  arguments *args_local;
  
  progress.progress._7_1_ = 1;
  progress.progress._6_1_ = 1;
  progress.progress._5_1_ = 0;
  progress.progress._0_4_ = 0;
  if ((((args->field_0x3c & 1) == 1) && (args->file_size == 0)) ||
     (((args->field_0x3c & 1) == 0 && (_Var1 = isGreaterThanThreeBlocks(args), !_Var1)))) {
    args_local._4_4_ = -4;
  }
  else {
    _Var1 = handleKeys(args,&runThreefizer::tf_key,(MacCtx_t *)&temp_file_name);
    if (_Var1) {
      puVar2 = skeinHash(args->target_file,10,args->state_size);
      puVar2 = binToHex(puVar2,10);
      pthread_mutex_init((pthread_mutex_t *)&mac_mutex.__data.__list.__next,
                         (pthread_mutexattr_t *)0x0);
      pthread_mutex_init((pthread_mutex_t *)&progress_mutex.__data.__list.__next,
                         (pthread_mutexattr_t *)0x0);
      pthread_mutex_init((pthread_mutex_t *)&write_mutex.__data.__list.__next,
                         (pthread_mutexattr_t *)0x0);
      pthread_mutex_init((pthread_mutex_t *)&crypto_params.tf_key,(pthread_mutexattr_t *)0x0);
      out = createQueue(10);
      out_00 = createQueue(10);
      out_01 = createQueue(10);
      setUpProgress(args,(progress_t *)&read_thread,
                    (pthread_mutex_t *)&write_mutex.__data.__list.__next);
      if (((args->field_0x3c & 1) == 1) && (args->file_size != 0)) {
        setUpReadParams((readParams *)&write_params.progress,args,
                        (_Bool *)((long)&progress.progress + 6),
                        (pthread_mutex_t *)&mac_mutex.__data.__list.__next,out,
                        (progress_t *)&read_thread,(int32_t *)&progress.progress);
        setUpCryptoParams((cryptParams *)&mac_params.file_size,args,
                          (_Bool *)((long)&progress.progress + 6),&runThreefizer::tf_key,
                          (pthread_mutex_t *)&mac_mutex.__data.__list.__next,
                          (pthread_mutex_t *)&progress_mutex.__data.__list.__next,out,out_00,
                          (progress_t *)&read_thread,(int32_t *)&progress.progress);
        setUpMacParams((macParams *)&read_params.out,(_Bool *)((long)&progress.progress + 7),
                       (_Bool *)((long)&progress.progress + 6),(_Bool *)0x0,
                       (MacCtx_t *)&temp_file_name,
                       (pthread_mutex_t *)&progress_mutex.__data.__list.__next,
                       (pthread_mutex_t *)&crypto_params.tf_key,out_00,out_01,
                       (progress_t *)&read_thread,(ThreefishKey_t *)0x0,
                       (int32_t *)&progress.progress,(uint64_t *)0x0);
        setUpWriteParams((writeParams *)&mac_context.digest_byte_size,args,
                         (_Bool *)((long)&progress.progress + 6),(_Bool *)0x0,
                         (pthread_mutex_t *)&crypto_params.tf_key,out_01,puVar2,
                         (progress_t *)&read_thread,(int32_t *)&progress.progress,(uint64_t *)0x0);
        _Var1 = queueHeader(args,out);
        if (!_Var1) {
          return -0xf;
        }
        args->field_0x3c = args->field_0x3c & 0xbf | 0x40;
        pthread_create(&crypto_thread,(pthread_attr_t *)0x0,queueFileForEncrypt,
                       &write_params.progress);
        pthread_create(&mac_thread,(pthread_attr_t *)0x0,encryptQueue,&mac_params.file_size);
        pthread_create(&write_thread,(pthread_attr_t *)0x0,generateMAC,&read_params.out);
        pthread_create((pthread_t *)(crypto_mutex.__size + 0x20),(pthread_attr_t *)0x0,asyncWrite,
                       &mac_context.digest_byte_size);
        if (51200000 < args->file_size) {
          printProgressBar((_Bool *)((long)&progress.progress + 6),(int *)&progress.progress,
                           (progress_t *)&read_thread);
        }
      }
      else {
        setUpReadParams((readParams *)&write_params.progress,args,
                        (_Bool *)((long)&progress.progress + 6),
                        (pthread_mutex_t *)&progress_mutex.__data.__list.__next,out_00,
                        (progress_t *)&read_thread,(int32_t *)&progress.progress);
        setUpMacParams((macParams *)&read_params.out,(_Bool *)((long)&progress.progress + 7),
                       (_Bool *)((long)&progress.progress + 6),
                       (_Bool *)((long)&progress.progress + 5),(MacCtx_t *)&temp_file_name,
                       (pthread_mutex_t *)&progress_mutex.__data.__list.__next,
                       (pthread_mutex_t *)&mac_mutex.__data.__list.__next,out_00,out,
                       (progress_t *)&read_thread,&runThreefizer::tf_key,
                       (int32_t *)&progress.progress,&runThreefizer::new_file_size);
        setUpCryptoParams((cryptParams *)&mac_params.file_size,args,
                          (_Bool *)((long)&progress.progress + 6),&runThreefizer::tf_key,
                          (pthread_mutex_t *)&mac_mutex.__data.__list.__next,
                          (pthread_mutex_t *)&crypto_params.tf_key,out,out_01,
                          (progress_t *)&read_thread,(int32_t *)&progress.progress);
        setUpWriteParams((writeParams *)&mac_context.digest_byte_size,args,
                         (_Bool *)((long)&progress.progress + 6),
                         (_Bool *)((long)&progress.progress + 5),
                         (pthread_mutex_t *)&crypto_params.tf_key,out_01,puVar2,
                         (progress_t *)&read_thread,(int32_t *)&progress.progress,
                         &runThreefizer::new_file_size);
        args->field_0x3c = args->field_0x3c & 0xbf | 0x40;
        pthread_create(&crypto_thread,(pthread_attr_t *)0x0,queueFileForDecrypt,
                       &write_params.progress);
        pthread_create(&write_thread,(pthread_attr_t *)0x0,authenticateMAC,&read_params.out);
        pthread_create(&mac_thread,(pthread_attr_t *)0x0,decryptQueue,&mac_params.file_size);
        pthread_create((pthread_t *)(crypto_mutex.__size + 0x20),(pthread_attr_t *)0x0,asyncWrite,
                       &mac_context.digest_byte_size);
        if (51200000 < args->file_size) {
          printProgressBar((_Bool *)((long)&progress.progress + 6),(int *)&progress.progress,
                           (progress_t *)&read_thread);
        }
      }
      if (((byte)args->field_0x3c >> 6 & 1) != 0) {
        pthread_join(crypto_thread,(void **)0x0);
        pthread_join(mac_thread,(void **)0x0);
        pthread_join(write_thread,(void **)0x0);
        pthread_join((pthread_t)crypto_mutex.__data.__list.__next,(void **)0x0);
      }
      pthread_mutex_destroy((pthread_mutex_t *)&mac_mutex.__data.__list.__next);
      pthread_mutex_destroy((pthread_mutex_t *)&progress_mutex.__data.__list.__next);
      pthread_mutex_destroy((pthread_mutex_t *)&write_mutex.__data.__list.__next);
      pthread_mutex_destroy((pthread_mutex_t *)&crypto_params.tf_key);
      destroyQueue(out);
      destroyQueue(out_00);
      destroyQueue(out_01);
      if (args->iv != (uint64_t *)0x0) {
        free(args->iv);
      }
      if (((int)progress.progress != 0) && (puVar2 != (uint8_t *)0x0)) {
        unlink((char *)puVar2);
      }
      if (puVar2 != (uint8_t *)0x0) {
        free(puVar2);
      }
      if ((int)progress.progress == 0) {
        local_42c = 0;
      }
      else {
        local_42c = (int)progress.progress;
      }
      args_local._4_4_ = local_42c;
    }
    else {
      args_local._4_4_ = -9;
    }
  }
  return args_local._4_4_;
}

Assistant:

int runThreefizer(arguments* args)
{
    bool mac_status = true;
    bool running = true;
    bool valid = false;
    int32_t error = 0;
    progress_t progress;
    pthread_t read_thread;
    pthread_t crypto_thread;
    pthread_t mac_thread;
    pthread_t write_thread;
    pthread_mutex_t crypto_mutex;
    pthread_mutex_t mac_mutex;
    pthread_mutex_t progress_mutex;
    pthread_mutex_t write_mutex;
    cryptParams crypto_params;
    macParams mac_params;
    readParams read_params;
    writeParams write_params;
    MacCtx_t mac_context;
    static uint64_t new_file_size = 0;
    static ThreefishKey_t tf_key;

    pdebug("Threefizer controller\n");
    pdebug("Arguments { ");
    pdebug("key_file: %s, password: %s, rename_file: %s, target_file: %s, iv: [%08x] encrypt: %d, free: %d, hash: %d, hash_from_file: %d, legacy_hash: %d, rename: %d, threads_active: %d, state_size: %d, file_size: %d, pw_length: %d",
           args->key_file,
           args->password,
           args->rename_file,
           args->target_file,
           &args->iv,
           args->encrypt,
           args->free,
           args->hash,
           args->hash_from_file,
           args->legacy_hash,
           args->rename,
           args->threads_active,
           args->state_size,
           args->file_size,
           args->pw_length);
    pdebug(" }\n");

    //check the file size
    if((args->encrypt == true && args->file_size == 0) ||
       (args->encrypt == false && !isGreaterThanThreeBlocks(args)))
    {
        return FILE_TOO_SMALL;
    }
    else if(!handleKeys(args, &tf_key, &mac_context)) //generate and initialize keys
    {
        return KEY_GENERATION_FAIL; 
    }

    /* Create the temp file name
     * the temp file name is a partial skein hash of the original file name
     * this should prevent filename collisions in all sane cases. */
    const uint8_t* temp_file_name = binToHex(skeinHash((uint8_t*)args->target_file,
                                             TEMP_FILE_NAME_SIZE,
                                             args->state_size),
                                             TEMP_FILE_NAME_SIZE);

    /*
     * Init resrouces threefizer needs to operate 
     */
    pthread_mutex_init(&crypto_mutex, NULL);
    pthread_mutex_init(&mac_mutex, NULL);
    pthread_mutex_init(&progress_mutex, NULL);
    pthread_mutex_init(&write_mutex, NULL);
    queue* crypto_queue = createQueue(QUE_SIZE);
    queue* mac_queue = createQueue(QUE_SIZE);
    queue* write_queue = createQueue(QUE_SIZE);
    setUpProgress(args, &progress, &progress_mutex);

    //Encrypting
    if(args->encrypt == true && args->file_size > 0)
    {
        //set up threads
        setUpReadParams(&read_params,
                        args,
                        &running,
                        &crypto_mutex,
                        crypto_queue,
                        &progress,
                        &error);

        setUpCryptoParams(&crypto_params,
                          args,
                          &running,
                          &tf_key,
                          &crypto_mutex,
                          &mac_mutex,
                          crypto_queue,
                          mac_queue,
                          &progress,
                          &error);

        setUpMacParams(&mac_params,
                       &mac_status,
                       &running,
                       NULL,
                       &mac_context,
                       &mac_mutex,
                       &write_mutex,
                       mac_queue,
                       write_queue,
                       &progress,
                       NULL,
                       &error,
                       NULL);

        setUpWriteParams(&write_params,
                         args,
                         &running,
                         NULL,
                         &write_mutex,
                         write_queue,
                         temp_file_name,
                         &progress,
                         &error,
                         NULL);

        /* generate and queue the Header before we start reading the file so its
         * the first thing in the queue*/
        if(queueHeader(args, crypto_queue) == true)
        {
            //start the threads
            args->threads_active = true;
            pthread_create(&read_thread, NULL, queueFileForEncrypt, &read_params);
            pthread_create(&crypto_thread, NULL, encryptQueue, &crypto_params);
            pthread_create(&mac_thread, NULL, generateMAC, &mac_params);
            pthread_create(&write_thread, NULL, asyncWrite, &write_params);

            /* Display the progress bar if the files is big enough that we have to break
            * it into chunks. */
            if(args->file_size > MAX_CHUNK_SIZE)
            { printProgressBar(&running, &error, &progress); }
        }
        else { return QUEUE_OPERATION_FAIL; } 
    } //end encryption
    else //decryption
    {
        //set up threads
        setUpReadParams(&read_params,
                        args,
                        &running,
                        &mac_mutex,
                        mac_queue,
                        &progress,
                        &error);

        setUpMacParams(&mac_params,
                       &mac_status,
                       &running,
                       &valid,
                       &mac_context,
                       &mac_mutex,
                       &crypto_mutex,
                       mac_queue,
                       crypto_queue,
                       &progress,
                       &tf_key,
                       &error,
                       &new_file_size);

        setUpCryptoParams(&crypto_params,
                          args,
                          &running,
                          &tf_key,
                          &crypto_mutex,
                          &write_mutex,
                          crypto_queue,
                          write_queue,
                          &progress,
                          &error);

        setUpWriteParams(&write_params,
                         args,
                         &running,
                         &valid,
                         &write_mutex,
                         write_queue,
                         temp_file_name,
                         &progress, 
                         &error,
                         &new_file_size);

        //start threads
        args->threads_active = true;
        pthread_create(&read_thread, NULL, queueFileForDecrypt, &read_params);
        pthread_create(&mac_thread, NULL, authenticateMAC, &mac_params);
        pthread_create(&crypto_thread, NULL, decryptQueue, &crypto_params);
        pthread_create(&write_thread, NULL, asyncWrite, &write_params);

        /* Display the progress bar if the files is big enough that we have to break
         * it into chunks. */
        if(args->file_size > MAX_CHUNK_SIZE)
        { printProgressBar(&running, &error, &progress); }
    } //end encryption

    //free all allocated resources
    if(args->threads_active) 
    {   //wait for threads to finish
        pthread_join(read_thread, NULL);
        pthread_join(crypto_thread, NULL);
        pthread_join(mac_thread, NULL);
        pthread_join(write_thread, NULL);
        pdebug("All threads joined\n");
    }

    //free all allocated resources
    pthread_mutex_destroy(&crypto_mutex);
    pthread_mutex_destroy(&mac_mutex);
    pthread_mutex_destroy(&progress_mutex);
    pthread_mutex_destroy(&write_mutex);
    destroyQueue(crypto_queue);
    destroyQueue(mac_queue);
    destroyQueue(write_queue);
    if(args->iv != NULL) { free(args->iv); }

    if(error != 0)
    {
        //if an error occured then delete the temp file
        if(temp_file_name != NULL) { unlink((char*)temp_file_name); }
    }

    if(temp_file_name != NULL) { free((void*)temp_file_name); }

    pdebug("Resources freed\n");

    return error == 0 ? THREEFIZER_SUCCESS : error;
}